

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

void nifti_swap_4bytes(size_t n,void *ar)

{
  undefined4 uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  size_t sVar6;
  uchar *cp0;
  undefined1 auVar7 [16];
  
  if (n != 0) {
    sVar6 = 0;
    do {
      uVar1 = *(undefined4 *)((long)ar + sVar6 * 4);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)
                                                  (byte)((uint)uVar1 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar1 >> 0x10),uVar1)) >>
                                                  0x20),uVar1) >> 0x18),
                                                  CONCAT12((char)((uint)uVar1 >> 8),(short)uVar1))
                                           >> 0x10),(short)uVar1) & 0xffff00ff00ff00ff;
      auVar7 = pshuflw(auVar7,auVar7,0x1b);
      sVar2 = auVar7._0_2_;
      sVar3 = auVar7._2_2_;
      sVar4 = auVar7._4_2_;
      sVar5 = auVar7._6_2_;
      *(uint *)((long)ar + sVar6 * 4) =
           CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar7[6] - (0xff < sVar5),
                    CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar7[4] - (0xff < sVar4),
                             CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar7[2] - (0xff < sVar3),
                                      (0 < sVar2) * (sVar2 < 0x100) * auVar7[0] - (0xff < sVar2))));
      sVar6 = sVar6 + 1;
    } while (n != sVar6);
  }
  return;
}

Assistant:

void nifti_swap_4bytes( size_t n , void *ar )    /* 4 bytes at a time */
{
   register size_t ii ;
   unsigned char * cp0 = (unsigned char *)ar, * cp1, * cp2 ;
   register unsigned char tval ;

   for( ii=0 ; ii < n ; ii++ ){
       cp1 = cp0; cp2 = cp0+3;
       tval = *cp1;  *cp1 = *cp2;  *cp2 = tval;
       cp1++;  cp2--;
       tval = *cp1;  *cp1 = *cp2;  *cp2 = tval;
       cp0 += 4;
   }
   return ;
}